

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_copyCCtx(ZSTD_CCtx *dstCCtx,ZSTD_CCtx *srcCCtx,unsigned_long_long pledgedSrcSize)

{
  size_t sVar1;
  ZSTD_freeFunction p_Var2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  BYTE *pBVar6;
  BYTE *pBVar7;
  U32 UVar8;
  U32 UVar9;
  ulong pledgedSrcSize_00;
  long lVar10;
  long lVar11;
  ZSTD_CCtx_params *pZVar12;
  undefined8 *puVar13;
  undefined8 *puVar14;
  long lVar15;
  ZSTD_CCtx_params in_stack_fffffffffffffee8;
  undefined1 local_98 [12];
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined8 uStack_80;
  ulong local_78;
  undefined4 local_70;
  
  if (srcCCtx->stage == ZSTDcs_init) {
    lVar15 = 0;
    pledgedSrcSize_00 = -(ulong)(pledgedSrcSize == 0) | pledgedSrcSize;
    sVar1 = srcCCtx->inBuffSize;
    (dstCCtx->customMem).opaque = (srcCCtx->customMem).opaque;
    p_Var2 = (srcCCtx->customMem).customFree;
    (dstCCtx->customMem).customAlloc = (srcCCtx->customMem).customAlloc;
    (dstCCtx->customMem).customFree = p_Var2;
    lVar11 = 0x10;
    pZVar12 = &dstCCtx->requestedParams;
    puVar13 = (undefined8 *)local_98;
    for (lVar10 = lVar11; lVar10 != 0; lVar10 = lVar10 + -1) {
      *puVar13 = *(undefined8 *)pZVar12;
      pZVar12 = (ZSTD_CCtx_params *)&(pZVar12->cParams).chainLog;
      puVar13 = puVar13 + 1;
    }
    uVar3 = (srcCCtx->appliedParams).cParams.hashLog;
    uVar4 = (srcCCtx->appliedParams).cParams.searchLog;
    uVar5 = (srcCCtx->appliedParams).cParams.minMatch;
    uStack_84 = uVar5;
    uStack_80._0_4_ = (srcCCtx->appliedParams).cParams.targetLength;
    uStack_80._4_4_ = (srcCCtx->appliedParams).cParams.strategy;
    local_98._4_4_ = (srcCCtx->appliedParams).cParams.windowLog;
    local_98._8_4_ = (srcCCtx->appliedParams).cParams.chainLog;
    uStack_8c = uVar3;
    local_88 = uVar4;
    local_78 = (ulong)(pledgedSrcSize_00 != 0xffffffffffffffff);
    local_70 = 0;
    puVar13 = (undefined8 *)local_98;
    puVar14 = (undefined8 *)&stack0xfffffffffffffee8;
    for (; lVar11 != 0; lVar11 = lVar11 + -1) {
      *puVar14 = *puVar13;
      puVar13 = puVar13 + 1;
      puVar14 = puVar14 + 1;
    }
    ZSTD_resetCCtx_internal
              (dstCCtx,in_stack_fffffffffffffee8,pledgedSrcSize_00,ZSTDcrp_noMemset,
               (uint)(sVar1 != 0));
    if ((srcCCtx->appliedParams).cParams.strategy != ZSTD_fast) {
      lVar15 = 1L << ((byte)(srcCCtx->appliedParams).cParams.chainLog & 0x3f);
    }
    memcpy((dstCCtx->blockState).matchState.hashTable,(srcCCtx->blockState).matchState.hashTable,
           ((1L << ((byte)(srcCCtx->blockState).matchState.hashLog3 & 0x3f)) +
           (1L << ((byte)(srcCCtx->appliedParams).cParams.hashLog & 0x3f)) + lVar15) * 4);
    pBVar6 = (srcCCtx->blockState).matchState.window.base;
    pBVar7 = (srcCCtx->blockState).matchState.window.dictBase;
    UVar8 = (srcCCtx->blockState).matchState.window.dictLimit;
    UVar9 = (srcCCtx->blockState).matchState.window.lowLimit;
    (dstCCtx->blockState).matchState.window.nextSrc =
         (srcCCtx->blockState).matchState.window.nextSrc;
    (dstCCtx->blockState).matchState.window.base = pBVar6;
    (dstCCtx->blockState).matchState.window.dictBase = pBVar7;
    (dstCCtx->blockState).matchState.window.dictLimit = UVar8;
    (dstCCtx->blockState).matchState.window.lowLimit = UVar9;
    (dstCCtx->blockState).matchState.nextToUpdate3 = (srcCCtx->blockState).matchState.nextToUpdate3;
    UVar8 = (srcCCtx->blockState).matchState.nextToUpdate;
    (dstCCtx->blockState).matchState.loadedDictEnd = (srcCCtx->blockState).matchState.loadedDictEnd;
    (dstCCtx->blockState).matchState.nextToUpdate = UVar8;
    dstCCtx->dictID = srcCCtx->dictID;
    memcpy((dstCCtx->blockState).prevCBlock,(srcCCtx->blockState).prevCBlock,0x11f0);
    return 0;
  }
  return 0xffffffffffffffc4;
}

Assistant:

static size_t ZSTD_copyCCtx_internal(ZSTD_CCtx* dstCCtx,
                            const ZSTD_CCtx* srcCCtx,
                            ZSTD_frameParameters fParams,
                            U64 pledgedSrcSize,
                            ZSTD_buffered_policy_e zbuff)
{
    DEBUGLOG(5, "ZSTD_copyCCtx_internal");
    if (srcCCtx->stage!=ZSTDcs_init) return ERROR(stage_wrong);

    memcpy(&dstCCtx->customMem, &srcCCtx->customMem, sizeof(ZSTD_customMem));
    {   ZSTD_CCtx_params params = dstCCtx->requestedParams;
        /* Copy only compression parameters related to tables. */
        params.cParams = srcCCtx->appliedParams.cParams;
        params.fParams = fParams;
        ZSTD_resetCCtx_internal(dstCCtx, params, pledgedSrcSize,
                                ZSTDcrp_noMemset, zbuff);
        assert(dstCCtx->appliedParams.cParams.windowLog == srcCCtx->appliedParams.cParams.windowLog);
        assert(dstCCtx->appliedParams.cParams.strategy == srcCCtx->appliedParams.cParams.strategy);
        assert(dstCCtx->appliedParams.cParams.hashLog == srcCCtx->appliedParams.cParams.hashLog);
        assert(dstCCtx->appliedParams.cParams.chainLog == srcCCtx->appliedParams.cParams.chainLog);
        assert(dstCCtx->blockState.matchState.hashLog3 == srcCCtx->blockState.matchState.hashLog3);
    }

    /* copy tables */
    {   size_t const chainSize = (srcCCtx->appliedParams.cParams.strategy == ZSTD_fast) ? 0 : ((size_t)1 << srcCCtx->appliedParams.cParams.chainLog);
        size_t const hSize =  (size_t)1 << srcCCtx->appliedParams.cParams.hashLog;
        size_t const h3Size = (size_t)1 << srcCCtx->blockState.matchState.hashLog3;
        size_t const tableSpace = (chainSize + hSize + h3Size) * sizeof(U32);
        assert((U32*)dstCCtx->blockState.matchState.chainTable == (U32*)dstCCtx->blockState.matchState.hashTable + hSize);  /* chainTable must follow hashTable */
        assert((U32*)dstCCtx->blockState.matchState.hashTable3 == (U32*)dstCCtx->blockState.matchState.chainTable + chainSize);
        memcpy(dstCCtx->blockState.matchState.hashTable, srcCCtx->blockState.matchState.hashTable, tableSpace);   /* presumes all tables follow each other */
    }

    /* copy dictionary offsets */
    {
        const ZSTD_matchState_t* srcMatchState = &srcCCtx->blockState.matchState;
        ZSTD_matchState_t* dstMatchState = &dstCCtx->blockState.matchState;
        dstMatchState->window       = srcMatchState->window;
        dstMatchState->nextToUpdate = srcMatchState->nextToUpdate;
        dstMatchState->nextToUpdate3= srcMatchState->nextToUpdate3;
        dstMatchState->loadedDictEnd= srcMatchState->loadedDictEnd;
    }
    dstCCtx->dictID = srcCCtx->dictID;

    /* copy block state */
    memcpy(dstCCtx->blockState.prevCBlock, srcCCtx->blockState.prevCBlock, sizeof(*srcCCtx->blockState.prevCBlock));

    return 0;
}